

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O3

void __thiscall ApplicationContext::~ApplicationContext(ApplicationContext *this)

{
  CSP *this_00;
  pointer piVar1;
  Blackboard *pBVar2;
  
  (this->super_ApplicationContextBase)._vptr_ApplicationContextBase =
       (_func_int **)&PTR__ApplicationContext_001e1640;
  (this->super_ApplicationContextBase).join_now = true;
  std::thread::join();
  this_00 = this->csp;
  if (this_00 != (CSP *)0x0) {
    moodycamel::ConcurrentQueue<CSP_Event,_moodycamel::ConcurrentQueueDefaultTraits>::
    ~ConcurrentQueue(&this_00->q);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int)>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int)>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(int)>_>_>_>
    ::~_Rb_tree(&(this_00->lambdas)._M_t);
    piVar1 = (this_00->process_active).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (piVar1 != (pointer)0x0) {
      operator_delete(piVar1,(long)(this_00->process_active).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)piVar1);
    }
    std::
    vector<std::unique_ptr<CSP_Process,_std::default_delete<CSP_Process>_>,_std::allocator<std::unique_ptr<CSP_Process,_std::default_delete<CSP_Process>_>_>_>
    ::~vector(&this_00->processes);
  }
  operator_delete(this_00,0x2f0);
  pBVar2 = this->blackboard;
  if (pBVar2 != (Blackboard *)0x0) {
    std::
    _Rb_tree<int,_std::pair<const_int,_TypedData_*>,_std::_Select1st<std::pair<const_int,_TypedData_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_TypedData_*>_>_>
    ::~_Rb_tree(&(pBVar2->values)._M_t);
  }
  operator_delete(pBVar2,0x60);
  std::vector<JournalEntry,_std::allocator<JournalEntry>_>::~vector(&this->journal);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->lines);
  if ((this->clock)._M_id._M_thread == 0) {
    ApplicationContextBase::~ApplicationContextBase(&this->super_ApplicationContextBase);
    return;
  }
  std::terminate();
}

Assistant:

~ApplicationContext()
    {
        ///>
        /// join_now is most likely true from having been set by a Quit
        /// event, but just to be sure, set it here.
        ///<C++
        join_now = true;

        ///>
        /// Allow the clock thread to join gracefully
        ///<C++
        clock.join();

        delete csp;
        delete blackboard;
    }